

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

bool P_Thing_Spawn(int tid,AActor *source,int type,DAngle *angle,bool fog,int newtid)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  PClassActor *pPVar4;
  AActor *mobj;
  Angle *pAVar5;
  int iVar6;
  DVector3 local_58;
  FActorIterator iterator;
  
  iterator.base = (AActor *)0x0;
  iterator.id = tid;
  pPVar4 = P_GetSpawnableType(type);
  if ((pPVar4 != (PClassActor *)0x0) &&
     ((pPVar4 = PClassActor::GetReplacement(pPVar4,true),
      ((pPVar4->super_PClass).Defaults[0x195] & 0x20) == 0 ||
      ((level.flags2 & 0x8000) == 0 && (dmflags.Value & 0x1000U) == 0)))) {
    if (tid != 0) {
      source = FActorIterator::Next(&iterator);
    }
    iVar6 = 0;
    while (source != (AActor *)0x0) {
      local_58.X = (source->__Pos).X;
      local_58.Y = (source->__Pos).Y;
      local_58.Z = (source->__Pos).Z;
      mobj = Spawn(pPVar4,&local_58,ALLOW_REPLACE);
      if (mobj != (AActor *)0x0) {
        uVar1 = (mobj->flags2).Value;
        (mobj->flags2).Value = uVar1 | 0x1000;
        bVar3 = P_TestMobjLocation(mobj);
        if (bVar3) {
          pAVar5 = &(source->Angles).Yaw;
          if (angle->Degrees != 1000000.0) {
            pAVar5 = angle;
          }
          if (NAN(angle->Degrees)) {
            pAVar5 = angle;
          }
          (mobj->Angles).Yaw.Degrees = pAVar5->Degrees;
          if (fog) {
            local_58.X = (source->__Pos).X;
            local_58.Y = (source->__Pos).Y;
            local_58.Z = (source->__Pos).Z;
            P_SpawnTeleportFog(mobj,&local_58,false,true);
          }
          uVar2 = (mobj->flags).Value;
          if ((uVar2 & 1) != 0) {
            (mobj->flags).Value = uVar2 | 0x20000;
          }
          iVar6 = iVar6 + 1;
          mobj->tid = newtid;
          AActor::AddToHash(mobj);
          (mobj->flags2).Value = uVar1;
        }
        else {
          AActor::ClearCounters(mobj);
          (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
        }
      }
      source = FActorIterator::Next(&iterator);
    }
    return iVar6 != 0;
  }
  return false;
}

Assistant:

bool P_Thing_Spawn (int tid, AActor *source, int type, DAngle angle, bool fog, int newtid)
{
	int rtn = 0;
	PClassActor *kind;
	AActor *spot, *mobj;
	FActorIterator iterator (tid);

	kind = P_GetSpawnableType(type);

	if (kind == NULL)
		return false;

	// Handle decorate replacements.
	kind = kind->GetReplacement();

	if ((GetDefaultByType(kind)->flags3 & MF3_ISMONSTER) && 
		((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		return false;

	if (tid == 0)
	{
		spot = source;
	}
	else
	{
		spot = iterator.Next();
	}
	while (spot != NULL)
	{
		mobj = Spawn (kind, spot->Pos(), ALLOW_REPLACE);

		if (mobj != NULL)
		{
			ActorFlags2 oldFlags2 = mobj->flags2;
			mobj->flags2 |= MF2_PASSMOBJ;
			if (P_TestMobjLocation (mobj))
			{
				rtn++;
				mobj->Angles.Yaw = (angle != 1000000. ? angle : spot->Angles.Yaw);
				if (fog)
				{
					P_SpawnTeleportFog(mobj, spot->Pos(), false, true);
				}
				if (mobj->flags & MF_SPECIAL)
					mobj->flags |= MF_DROPPED;	// Don't respawn
				mobj->tid = newtid;
				mobj->AddToHash ();
				mobj->flags2 = oldFlags2;
			}
			else
			{
				// If this is a monster, subtract it from the total monster
				// count, because it already added to it during spawning.
				mobj->ClearCounters();
				mobj->Destroy ();
			}
		}
		spot = iterator.Next();
	}

	return rtn != 0;
}